

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

EncodingType httplib::detail::encoding_type(Request *req,Response *res)

{
  bool bVar1;
  string local_80;
  string *local_60;
  string *s;
  string local_48;
  undefined1 local_21;
  Response *pRStack_20;
  bool ret;
  Response *res_local;
  Request *req_local;
  
  pRStack_20 = res;
  res_local = (Response *)req;
  Response::get_header_value_abi_cxx11_(&local_48,res,"Content-Type",0);
  bVar1 = can_compress_content_type(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    local_21 = bVar1;
    Request::get_header_value_abi_cxx11_(&local_80,(Request *)res_local,"Accept-Encoding",0);
    local_60 = &local_80;
    req_local._4_4_ = None;
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    req_local._4_4_ = None;
  }
  return req_local._4_4_;
}

Assistant:

inline EncodingType encoding_type(const Request &req, const Response &res) {
  auto ret =
      detail::can_compress_content_type(res.get_header_value("Content-Type"));
  if (!ret) { return EncodingType::None; }

  const auto &s = req.get_header_value("Accept-Encoding");
  (void)(s);

#ifdef CPPHTTPLIB_BROTLI_SUPPORT
  // TODO: 'Accept-Encoding' has br, not br;q=0
  ret = s.find("br") != std::string::npos;
  if (ret) { return EncodingType::Brotli; }
#endif

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
  ret = s.find("gzip") != std::string::npos;
  if (ret) { return EncodingType::Gzip; }
#endif

  return EncodingType::None;
}